

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall llvm::DWARFVerifier::verifyNameIndexAbbrevs(DWARFVerifier *this,NameIndex *NI)

{
  AttributeEncoding *pAVar1;
  uint uVar2;
  Abbrev *pAVar3;
  raw_ostream *prVar4;
  pair<llvm::NoneType,_bool> pVar5;
  size_type sVar6;
  AttributeEncoding *pAVar7;
  undefined1 in_R8B;
  pointer *ppvVar8;
  Abbrev *pAVar9;
  StringRef SVar10;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef Fmt_02;
  undefined1 local_168 [8];
  SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> Attributes;
  const_iterator __begin1;
  void *local_f0;
  long local_e0;
  void *local_d8;
  long local_c8;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
  local_88;
  Abbrev *local_58;
  _func_int **local_50;
  _func_int **local_48;
  DWARFVerifier *local_40;
  uint local_34;
  
  if ((NI->Hdr).super_HeaderPOD.LocalTypeUnitCount + (NI->Hdr).super_HeaderPOD.ForeignTypeUnitCount
      == 0) {
    join_0x00000010_0x00000000_ =
         (const_iterator)
         detail::
         DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
         ::begin((DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                  *)NI);
    pAVar3 = &(NI->Abbrevs).
              super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
              .TheMap.Buckets
              [(NI->Abbrevs).
               super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
               .TheMap.NumBuckets].key;
    if (&(Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count)->key == pAVar3) {
      local_34 = 0;
    }
    else {
      local_50 = (_func_int **)&PTR_anchor_01078950;
      local_48 = (_func_int **)&PTR_anchor_01078920;
      local_34 = 0;
      pAVar9 = &(Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count)->key;
      local_40 = this;
      do {
        SVar10 = dwarf::TagString((uint)pAVar9->Tag);
        if (SVar10.Length == 0) {
          prVar4 = WithColor::warning((WithColor *)local_40->OS,(raw_ostream *)0xe67796,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
          Attributes.Vector._32_8_ = NI->Base;
          local_168 = (undefined1  [8])&PTR_anchor_01077fe8;
          Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
          super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase._8_8_ = local_50
          ;
          Attributes.Vector.super_SmallVectorStorage<unsigned_int,_5U>.InlineElts._8_8_ = local_48;
          Fmt.Length = 0x46;
          Fmt.Data = "NameIndex @ {0:x}: Abbreviation {1:x} references an unknown tag: {2}.\n";
          Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
          super_SmallVectorTemplateBase<unsigned_int,_true>.
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX =
               &pAVar9->Tag;
          Attributes.Vector.super_SmallVectorStorage<unsigned_int,_5U>.InlineElts._0_8_ = pAVar9;
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
          ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
                            *)&__begin1.I.End,Fmt,
                           (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>
                            *)local_168);
          raw_ostream::operator<<(prVar4,(formatv_object_base *)&__begin1.I.End);
          if (local_d8 != (void *)0x0) {
            operator_delete(local_d8,local_c8 - (long)local_d8);
          }
          if (local_f0 != (void *)0x0) {
            operator_delete(local_f0,local_e0 - (long)local_f0);
          }
        }
        local_168 = (undefined1  [8])
                    &Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
                     super_SmallVectorTemplateBase<unsigned_int,_true>.
                     super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
        Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
        super_SmallVectorTemplateBase<unsigned_int,_true>.
        super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX =
             (void *)0x500000000;
        Attributes.Set._M_t._M_impl._0_4_ = 0;
        Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&Attributes.Set;
        Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        pAVar1 = (pAVar9->Attributes).
                 super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_58 = pAVar9;
        for (pAVar7 = (pAVar9->Attributes).
                      super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppvVar8 = &__begin1.I.End,
            pAVar7 != pAVar1; pAVar7 = pAVar7 + 1) {
          __begin1.I.End._0_4_ = pAVar7->Index;
          pVar5 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::insert
                            ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)local_168,
                             (uint *)ppvVar8);
          if (((ulong)pVar5 >> 0x20 & 1) == 0) {
            prVar4 = WithColor::error((WithColor *)local_40->OS,(raw_ostream *)0xe67796,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
            _M_head_impl.Item = NI->Base;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
            ._M_head_impl.super_format_adapter._vptr_format_adapter =
                 (_func_int **)&PTR_anchor_01078018;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>
            ._M_head_impl.super_format_adapter._vptr_format_adapter = local_50;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>
            ._M_head_impl.Item = &local_58->Code;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
            _M_head_impl.super_format_adapter._vptr_format_adapter = local_48;
            ppvVar8 = &__begin1.I.End;
            Fmt_00.Length = 0x48;
            Fmt_00.Data = 
            "NameIndex @ {0:x}: Abbreviation {1:x} contains multiple {2} attributes.\n";
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
            ._M_head_impl.Item = &pAVar7->Index;
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>_>
            ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>_>
                              *)ppvVar8,Fmt_00,&local_88);
            raw_ostream::operator<<(prVar4,(formatv_object_base *)ppvVar8);
            if (local_d8 != (void *)0x0) {
              operator_delete(local_d8,local_c8 - (long)local_d8);
            }
            if (local_f0 != (void *)0x0) {
              operator_delete(local_f0,local_e0 - (long)local_f0);
            }
            local_34 = local_34 + 1;
          }
          else {
            uVar2 = verifyNameIndexAttribute(local_40,NI,local_58,*pAVar7);
            local_34 = local_34 + uVar2;
          }
        }
        pAVar9 = local_58;
        if (1 < (NI->Hdr).super_HeaderPOD.CompUnitCount) {
          __begin1.I.End._0_4_ = 1;
          sVar6 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
                            ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)local_168,
                             (uint *)ppvVar8);
          pAVar9 = local_58;
          if (sVar6 == 0) {
            prVar4 = WithColor::error((WithColor *)local_40->OS,(raw_ostream *)0xe67796,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
            _M_head_impl.Item = NI->Base;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
            ._M_head_impl.super_format_adapter._vptr_format_adapter =
                 (_func_int **)&PTR_anchor_01078ce8;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
            ._M_head_impl.Item =
                 (Index *)CONCAT44(local_88.
                                   super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
                                   .
                                   super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
                                   .
                                   super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
                                   .
                                   super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
                                   ._M_head_impl.Item._4_4_,1);
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>
            ._M_head_impl.super_format_adapter._vptr_format_adapter = local_50;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .
            super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>
            ._M_head_impl.Item = &pAVar9->Code;
            local_88.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
            .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
            _M_head_impl.super_format_adapter._vptr_format_adapter = local_48;
            ppvVar8 = &__begin1.I.End;
            Fmt_01.Length = 0x60;
            Fmt_01.Data = 
            "NameIndex @ {0:x}: Indexing multiple compile units and abbreviation {1:x} has no {2} attribute.\n"
            ;
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
            ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
                              *)ppvVar8,Fmt_01,
                             (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>
                              *)&local_88);
            raw_ostream::operator<<(prVar4,(formatv_object_base *)ppvVar8);
            if (local_d8 != (void *)0x0) {
              operator_delete(local_d8,local_c8 - (long)local_d8);
            }
            if (local_f0 != (void *)0x0) {
              operator_delete(local_f0,local_e0 - (long)local_f0);
            }
            local_34 = local_34 + 1;
          }
        }
        __begin1.I.End._0_4_ = 3;
        sVar6 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
                          ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)local_168,
                           (uint *)&__begin1.I.End);
        if (sVar6 == 0) {
          prVar4 = WithColor::error((WithColor *)local_40->OS,(raw_ostream *)0xe67796,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
          local_88.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
          _M_head_impl.Item = NI->Base;
          local_88.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
          ._M_head_impl.super_format_adapter._vptr_format_adapter =
               (_func_int **)&PTR_anchor_01078ce8;
          local_88.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
          ._M_head_impl.Item =
               (Index *)CONCAT44(local_88.
                                 super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
                                 .
                                 super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
                                 .
                                 super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
                                 .
                                 super__Head_base<2UL,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_false>
                                 ._M_head_impl.Item._4_4_,3);
          local_88.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>
          ._M_head_impl.super_format_adapter._vptr_format_adapter = local_50;
          local_88.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = local_48;
          ppvVar8 = &__begin1.I.End;
          Fmt_02.Length = 0x3c;
          Fmt_02.Data = "NameIndex @ {0:x}: Abbreviation {1:x} has no {2} attribute.\n";
          local_88.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>
          ._M_head_impl.Item = &pAVar9->Code;
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
          ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
                            *)ppvVar8,Fmt_02,
                           (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>
                            *)&local_88);
          raw_ostream::operator<<(prVar4,(formatv_object_base *)ppvVar8);
          if (local_d8 != (void *)0x0) {
            operator_delete(local_d8,local_c8 - (long)local_d8);
          }
          if (local_f0 != (void *)0x0) {
            operator_delete(local_f0,local_e0 - (long)local_f0);
          }
          local_34 = local_34 + 1;
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)(Attributes.Vector.super_SmallVectorStorage<unsigned_int,_5U>.InlineElts + 4)
                   );
        if (local_168 !=
            (undefined1  [8])
            &Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
             super_SmallVectorTemplateBase<unsigned_int,_true>.
             super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size) {
          free((void *)local_168);
        }
        Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)(Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20);
        DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
        ::AdvancePastEmptyBuckets
                  ((DenseMapIterator<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>,_true>
                    *)&Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pAVar9 = (Abbrev *)Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count;
      } while ((Abbrev *)Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count != pAVar3);
    }
  }
  else {
    prVar4 = WithColor::warning((WithColor *)this->OS,(raw_ostream *)0xe67796,(StringRef)ZEXT816(0),
                                (bool)in_R8B);
    Attributes.Vector.super_SmallVectorImpl<unsigned_int>.
    super_SmallVectorTemplateBase<unsigned_int,_true>.
    super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX =
         (void *)NI->Base;
    local_168 = (undefined1  [8])&PTR_anchor_01078920;
    ppvVar8 = &__begin1.I.End;
    SVar10.Length = 0x50;
    SVar10.Data = 
    "Name Index @ {0:x}: Verifying indexes of type units is not currently supported.\n";
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
    formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>
                    *)ppvVar8,SVar10,
                   (tuple<llvm::detail::provider_format_adapter<unsigned_long>_> *)local_168);
    raw_ostream::operator<<(prVar4,(formatv_object_base *)ppvVar8);
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8,local_c8 - (long)local_d8);
    }
    if (local_f0 != (void *)0x0) {
      operator_delete(local_f0,local_e0 - (long)local_f0);
    }
    local_34 = 0;
  }
  return local_34;
}

Assistant:

unsigned
DWARFVerifier::verifyNameIndexAbbrevs(const DWARFDebugNames::NameIndex &NI) {
  if (NI.getLocalTUCount() + NI.getForeignTUCount() > 0) {
    warn() << formatv("Name Index @ {0:x}: Verifying indexes of type units is "
                      "not currently supported.\n",
                      NI.getUnitOffset());
    return 0;
  }

  unsigned NumErrors = 0;
  for (const auto &Abbrev : NI.getAbbrevs()) {
    StringRef TagName = dwarf::TagString(Abbrev.Tag);
    if (TagName.empty()) {
      warn() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} references an "
                        "unknown tag: {2}.\n",
                        NI.getUnitOffset(), Abbrev.Code, Abbrev.Tag);
    }
    SmallSet<unsigned, 5> Attributes;
    for (const auto &AttrEnc : Abbrev.Attributes) {
      if (!Attributes.insert(AttrEnc.Index).second) {
        error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} contains "
                           "multiple {2} attributes.\n",
                           NI.getUnitOffset(), Abbrev.Code, AttrEnc.Index);
        ++NumErrors;
        continue;
      }
      NumErrors += verifyNameIndexAttribute(NI, Abbrev, AttrEnc);
    }

    if (NI.getCUCount() > 1 && !Attributes.count(dwarf::DW_IDX_compile_unit)) {
      error() << formatv("NameIndex @ {0:x}: Indexing multiple compile units "
                         "and abbreviation {1:x} has no {2} attribute.\n",
                         NI.getUnitOffset(), Abbrev.Code,
                         dwarf::DW_IDX_compile_unit);
      ++NumErrors;
    }
    if (!Attributes.count(dwarf::DW_IDX_die_offset)) {
      error() << formatv(
          "NameIndex @ {0:x}: Abbreviation {1:x} has no {2} attribute.\n",
          NI.getUnitOffset(), Abbrev.Code, dwarf::DW_IDX_die_offset);
      ++NumErrors;
    }
  }
  return NumErrors;
}